

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O2

bool TimingResistantEqual<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b)

{
  ulong uVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  
  uVar1 = b->_M_string_length;
  uVar2 = a->_M_string_length;
  uVar4 = uVar2;
  if (uVar1 != 0) {
    uVar4 = uVar2 ^ uVar1;
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      uVar4 = uVar4 | (long)(char)((b->_M_dataplus)._M_p[uVar3 % uVar1] ^
                                  (a->_M_dataplus)._M_p[uVar3]);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return uVar4 == 0;
}

Assistant:

bool TimingResistantEqual(const T& a, const T& b)
{
    if (b.size() == 0) return a.size() == 0;
    size_t accumulator = a.size() ^ b.size();
    for (size_t i = 0; i < a.size(); i++)
        accumulator |= size_t(a[i] ^ b[i%b.size()]);
    return accumulator == 0;
}